

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O1

FADFADSTATE * FADexp(FADFADSTATE *__return_storage_ptr__,FADFADSTATE *x)

{
  uint sz;
  double *pdVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  double dVar6;
  FADFADSTATE *expa;
  Fad<double> expaval;
  Fad<double> local_a0;
  double local_80;
  undefined1 local_78 [32];
  undefined1 local_58 [8];
  Fad<double> local_50;
  
  FadFuncExp<Fad<double>_>::FadFuncExp((FadFuncExp<Fad<double>_> *)local_78,&x->val_);
  FadExpr<FadFuncExp<Fad<double>_>_>::FadExpr
            ((FadExpr<FadFuncExp<Fad<double>_>_> *)local_58,(FadFuncExp<Fad<double>_> *)local_78);
  Fad<double>::~Fad((Fad<double> *)local_78);
  local_a0.val_ = exp(local_50.val_);
  iVar2 = local_50.dx_.num_elts;
  local_a0.dx_.num_elts = 0;
  local_a0.dx_.ptr_to_data = (double *)0x0;
  if ((long)local_50.dx_.num_elts < 1) {
    local_a0.defaultVal = 0.0;
  }
  else {
    local_a0.dx_.num_elts = local_50.dx_.num_elts;
    uVar3 = (long)local_50.dx_.num_elts << 3;
    local_a0.dx_.ptr_to_data = (double *)operator_new__(uVar3);
    local_a0.defaultVal = 0.0;
    if (0 < iVar2) {
      uVar4 = 0;
      do {
        pdVar1 = (double *)((long)local_50.dx_.ptr_to_data + uVar4);
        if (local_50.dx_.num_elts == 0) {
          pdVar1 = &local_50.defaultVal;
        }
        local_80 = *pdVar1;
        dVar6 = exp(local_50.val_);
        *(double *)((long)local_a0.dx_.ptr_to_data + uVar4) = dVar6 * local_80;
        uVar4 = uVar4 + 8;
      } while (uVar3 != uVar4);
    }
  }
  Fad<double>::~Fad(&local_50);
  sz = (x->dx_).num_elts;
  Fad<Fad<double>_>::Fad(__return_storage_ptr__,sz,&local_a0);
  if (0 < (int)sz) {
    lVar5 = 0;
    iVar2 = 0;
    do {
      Fad<Fad<double>_>::dx((Fad<double> *)local_58,x,iVar2);
      local_78._0_8_ = &local_a0;
      local_78._8_8_ = (Fad<double> *)local_58;
      Fad<double>::operator=
                ((Fad<double> *)((long)&((__return_storage_ptr__->dx_).ptr_to_data)->val_ + lVar5),
                 (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_78);
      Fad<double>::~Fad((Fad<double> *)local_58);
      iVar2 = iVar2 + 1;
      lVar5 = lVar5 + 0x20;
    } while ((ulong)sz << 5 != lVar5);
  }
  Fad<double>::~Fad(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

static FADFADSTATE FADexp(FADFADSTATE x)
{
    Fad<STATE> expaval = exp(x.val());
    int sz = x.size();
    FADFADSTATE expa(sz,expaval);
    for (int i=0; i<sz; i++) {
        expa.fastAccessDx(i) = expaval*x.dx(i);
    }
    return expa;
}